

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O3

Value * __thiscall GlobOpt::GetVarConstantValue(GlobOpt *this,AddrOpnd *addrOpnd)

{
  Sym *pSVar1;
  ValueInfo *this_00;
  BaseDictionary<Js::InternalString,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_01;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  Value *pVVar6;
  VarConstantValueInfo *pVVar7;
  JITJavascriptString *pJVar8;
  char16_t *string2;
  Var pvVar9;
  char16_t *string1;
  undefined1 local_60 [8];
  InternalString cachedInternalString;
  InternalString internalString;
  Value *local_38;
  Value *cachedValue;
  
  if ((((addrOpnd->addrOpndKind == AddrOpndKindDynamicVar) ||
       (addrOpnd->addrOpndKind == AddrOpndKindConstantVar)) &&
      (pvVar9 = addrOpnd->m_localAddress, pvVar9 != (Var)0x0)) &&
     (bVar2 = Js::VarIs<Js::RecyclableObject>(pvVar9), bVar2)) {
    bVar2 = **(int **)((long)pvVar9 + 8) == 7;
  }
  else {
    bVar2 = false;
  }
  local_38 = (Value *)0x0;
  bVar3 = JsUtil::
          BaseDictionary<void*,Value*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
          ::TryGetValue<void*>
                    ((BaseDictionary<void*,Value*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                      *)this->addrConstantToValueMap,&addrOpnd->m_address,&local_38);
  if (bVar3) {
    pSVar1 = local_38->valueInfo->symStore;
    if ((pSVar1 != (Sym *)0x0) &&
       (((bVar3 = GlobOptBlockData::IsLive(&this->currentBlock->globOptData,pSVar1), bVar3 &&
         (pVVar6 = GlobOptBlockData::FindValue(&this->currentBlock->globOptData,pSVar1),
         pVVar6 != (Value *)0x0)) && (pVVar6->valueNumber == local_38->valueNumber)))) {
      this_00 = pVVar6->valueInfo;
      bVar3 = ValueInfo::IsVarConstant(this_00);
      if ((bVar3) &&
         (pVVar7 = ValueInfo::AsVarConstant(this_00), pVVar7->varValue == addrOpnd->m_address))
      goto LAB_0044ffce;
    }
  }
  else if (bVar2) {
    pJVar8 = JITJavascriptString::FromVar(addrOpnd->m_localAddress);
    Js::InternalString::InternalString
              ((InternalString *)&cachedInternalString.m_content,pJVar8->m_pszValue,
               pJVar8->m_charLength,'\0');
    this_01 = this->stringConstantToValueMap;
    uVar4 = JsUtil::
            BaseDictionary<Js::InternalString,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            ::FindEntryWithKey<Js::InternalString>
                      (this_01,(InternalString *)&cachedInternalString.m_content);
    if (-1 < (int)uVar4) {
      local_38 = this_01->entries[uVar4].
                 super_DefaultHashedEntry<Js::InternalString,_Value_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                 .super_KeyValueEntry<Js::InternalString,_Value_*>.
                 super_ValueEntry<Value_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Js::InternalString,_Value_*>_>
                 .super_KeyValueEntryDataLayout2<Js::InternalString,_Value_*>.value;
      pSVar1 = local_38->valueInfo->symStore;
      if (((pSVar1 != (Sym *)0x0) &&
          (bVar3 = GlobOptBlockData::IsLive(&this->currentBlock->globOptData,pSVar1), bVar3)) &&
         ((pVVar6 = GlobOptBlockData::FindValue(&this->currentBlock->globOptData,pSVar1),
          pVVar6 != (Value *)0x0 &&
          ((pVVar6->valueNumber == local_38->valueNumber &&
           (bVar3 = ValueInfo::IsVarConstant(pVVar6->valueInfo), bVar3)))))) {
        pVVar7 = ValueInfo::AsVarConstant(pVVar6->valueInfo);
        pvVar9 = pVVar7->localVarValue;
        if (pvVar9 == (Var)0x0) {
          pvVar9 = pVVar7->varValue;
        }
        pJVar8 = JITJavascriptString::FromVar(pvVar9);
        Js::InternalString::InternalString
                  ((InternalString *)local_60,pJVar8->m_pszValue,pJVar8->m_charLength,'\0');
        if ((uint)cachedInternalString.m_content.ptr == local_60._0_4_) {
          string1 = (char16_t *)
                    ((ulong)((uint)cachedInternalString.m_content.ptr._4_1_ * 2) +
                    internalString._0_8_);
          string2 = (char16_t *)((ulong)((uint)local_60[4] * 2) + cachedInternalString._0_8_);
          if ((string1 == string2) ||
             (iVar5 = PAL_wmemcmp(string1,string2,(ulong)(uint)cachedInternalString.m_content.ptr),
             iVar5 == 0)) goto LAB_0044ffce;
        }
      }
    }
  }
  pVVar6 = NewVarConstantValue(this,addrOpnd,bVar2);
LAB_0044ffce:
  IR::Opnd::SetValueType
            (&addrOpnd->super_Opnd,
             (ValueType)
             *(anon_union_2_4_ea848c7b_for_ValueType_13 *)
              &(pVVar6->valueInfo->super_ValueType).field_0.field_0);
  return pVVar6;
}

Assistant:

Value *
GlobOpt::GetVarConstantValue(IR::AddrOpnd *addrOpnd)
{
    bool isVar = addrOpnd->IsVar();
    bool isString = isVar && addrOpnd->m_localAddress && JITJavascriptString::Is(addrOpnd->m_localAddress);
    Value *val = nullptr;
    Value *cachedValue = nullptr;
    if(this->addrConstantToValueMap->TryGetValue(addrOpnd->m_address, &cachedValue))
    {
        // The cached value could be from a different block since this is a global (as opposed to a per-block) cache. Since
        // values are cloned for each block, we can't use the same value object. We also can't have two values with the same
        // number in one block, so we can't simply copy the cached value either. And finally, there is no deterministic and fast
        // way to determine if a value with the same value number exists for this block. So the best we can do with a global
        // cache is to check the sym-store's value in the current block to see if it has a value with the same number.
        // Otherwise, we have to create a new value with a new value number.
        Sym *symStore = cachedValue->GetValueInfo()->GetSymStore();
        if(symStore && CurrentBlockData()->IsLive(symStore))
        {
            Value *const symStoreValue = CurrentBlockData()->FindValue(symStore);
            if(symStoreValue && symStoreValue->GetValueNumber() == cachedValue->GetValueNumber())
            {
                ValueInfo *const symStoreValueInfo = symStoreValue->GetValueInfo();
                if(symStoreValueInfo->IsVarConstant() && symStoreValueInfo->AsVarConstant()->VarValue() == addrOpnd->m_address)
                {
                    val = symStoreValue;
                }
            }
        }
    }
    else if (isString)
    {
        JITJavascriptString* jsString = JITJavascriptString::FromVar(addrOpnd->m_localAddress);
        Js::InternalString internalString(jsString->GetString(), jsString->GetLength());
        if (this->stringConstantToValueMap->TryGetValue(internalString, &cachedValue))
        {
            Sym *symStore = cachedValue->GetValueInfo()->GetSymStore();
            if (symStore && CurrentBlockData()->IsLive(symStore))
            {
                Value *const symStoreValue = CurrentBlockData()->FindValue(symStore);
                if (symStoreValue && symStoreValue->GetValueNumber() == cachedValue->GetValueNumber())
                {
                    ValueInfo *const symStoreValueInfo = symStoreValue->GetValueInfo();
                    if (symStoreValueInfo->IsVarConstant())
                    {
                        JITJavascriptString * cachedString = JITJavascriptString::FromVar(symStoreValue->GetValueInfo()->AsVarConstant()->VarValue(true));
                        Js::InternalString cachedInternalString(cachedString->GetString(), cachedString->GetLength());
                        if (Js::InternalStringComparer::Equals(internalString, cachedInternalString))
                        {
                            val = symStoreValue;
                        }
                    }
                }
            }
        }
    }

    if(!val)
    {
        val = NewVarConstantValue(addrOpnd, isString);
    }

    addrOpnd->SetValueType(val->GetValueInfo()->Type());
    return val;
}